

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LoopLayerParams::Clear(LoopLayerParams *this)

{
  string *default_value;
  Arena *pAVar1;
  LoopLayerParams *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->conditionvar_,default_value);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->conditionnetwork_ != (NeuralNetwork *)0x0)) &&
     (this->conditionnetwork_ != (NeuralNetwork *)0x0)) {
    (*(this->conditionnetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->conditionnetwork_ = (NeuralNetwork *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->bodynetwork_ != (NeuralNetwork *)0x0)) &&
     (this->bodynetwork_ != (NeuralNetwork *)0x0)) {
    (*(this->bodynetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bodynetwork_ = (NeuralNetwork *)0x0;
  this->maxloopiterations_ = 0;
  return;
}

Assistant:

void LoopLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LoopLayerParams)
  conditionvar_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && conditionnetwork_ != NULL) {
    delete conditionnetwork_;
  }
  conditionnetwork_ = NULL;
  if (GetArenaNoVirtual() == NULL && bodynetwork_ != NULL) {
    delete bodynetwork_;
  }
  bodynetwork_ = NULL;
  maxloopiterations_ = GOOGLE_ULONGLONG(0);
}